

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<int>::Clear
          (RepeatedFieldWrapper<int> *this,Field *data)

{
  RepeatedField<int> *this_00;
  Field *data_local;
  RepeatedFieldWrapper<int> *this_local;
  
  this_00 = (RepeatedField<int> *)(**(code **)(*(long *)this + 0x88))(this,data);
  RepeatedField<int>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }